

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

int mbedtls_x509_crt_verify_with_profile
              (mbedtls_x509_crt *crt,mbedtls_x509_crt *trust_ca,mbedtls_x509_crl *ca_crl,
              mbedtls_x509_crt_profile *profile,char *cn,uint32_t *flags,
              _func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *f_vrfy,void *p_vrfy)

{
  ulong uVar1;
  int iVar2;
  size_t len;
  mbedtls_x509_buf *name;
  mbedtls_x509_crt *parent;
  mbedtls_x509_crt *parent_00;
  mbedtls_asn1_named_data *pmVar3;
  
  if (profile == (mbedtls_x509_crt_profile *)0x0) {
    return -0x2800;
  }
  *flags = 0;
  parent = trust_ca;
  if (cn != (char *)0x0) {
    len = strlen(cn);
    if ((crt->ext_types & 0x20) == 0) {
      for (pmVar3 = &crt->subject; pmVar3 != (mbedtls_asn1_named_data *)0x0; pmVar3 = pmVar3->next)
      {
        if ((((pmVar3->oid).len == 3) && (iVar2 = bcmp("U\x04\x03",(pmVar3->oid).p,3), iVar2 == 0))
           && (((uVar1 = (pmVar3->val).len, uVar1 == len &&
                (iVar2 = x509_memcasecmp((pmVar3->val).p,cn,len), iVar2 == 0)) ||
               (((2 < uVar1 && (*(short *)(pmVar3->val).p == 0x2e2a)) &&
                (iVar2 = x509_check_wildcard(cn,&pmVar3->val), iVar2 == 0)))))) goto LAB_001406cd;
      }
    }
    else {
      for (name = &(crt->subject_alt_names).buf; name != (mbedtls_x509_buf *)0x0;
          name = *(mbedtls_x509_buf **)(name + 1)) {
        uVar1 = name->len;
        if (((uVar1 == len) && (iVar2 = x509_memcasecmp(cn,name->p,len), iVar2 == 0)) ||
           ((2 < uVar1 &&
            ((*(short *)name->p == 0x2e2a && (iVar2 = x509_check_wildcard(cn,name), iVar2 == 0))))))
        goto LAB_001406cd;
      }
    }
    *flags = 4;
  }
LAB_001406cd:
  do {
    parent_00 = crt;
    if (parent == (mbedtls_x509_crt *)0x0) goto LAB_001406f4;
    iVar2 = x509_crt_check_parent(crt,parent,0,1);
    if (iVar2 == 0) break;
    parent = parent->next;
  } while( true );
LAB_00140750:
  iVar2 = x509_crt_verify_top(crt,parent,ca_crl,profile,0,flags,f_vrfy,p_vrfy);
  goto LAB_00140772;
  while (iVar2 = x509_crt_check_parent(crt,parent_00,0,1), iVar2 != 0) {
LAB_001406f4:
    parent_00 = parent_00->next;
    parent = trust_ca;
    if (parent_00 == (mbedtls_x509_crt *)0x0) goto LAB_00140750;
  }
  iVar2 = x509_crt_verify_child(crt,parent_00,trust_ca,ca_crl,profile,0,flags,f_vrfy,p_vrfy);
LAB_00140772:
  if ((iVar2 == 0) && (iVar2 = -0x2700, *flags == 0)) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mbedtls_x509_crt_verify_with_profile( mbedtls_x509_crt *crt,
                     mbedtls_x509_crt *trust_ca,
                     mbedtls_x509_crl *ca_crl,
                     const mbedtls_x509_crt_profile *profile,
                     const char *cn, uint32_t *flags,
                     int (*f_vrfy)(void *, mbedtls_x509_crt *, int, uint32_t *),
                     void *p_vrfy )
{
    size_t cn_len;
    int ret;
    int pathlen = 0;
    mbedtls_x509_crt *parent;
    mbedtls_x509_name *name;
    mbedtls_x509_sequence *cur = NULL;

    if( profile == NULL )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    *flags = 0;

    if( cn != NULL )
    {
        name = &crt->subject;
        cn_len = strlen( cn );

        if( crt->ext_types & MBEDTLS_X509_EXT_SUBJECT_ALT_NAME )
        {
            cur = &crt->subject_alt_names;

            while( cur != NULL )
            {
                if( cur->buf.len == cn_len &&
                    x509_memcasecmp( cn, cur->buf.p, cn_len ) == 0 )
                    break;

                if( cur->buf.len > 2 &&
                    memcmp( cur->buf.p, "*.", 2 ) == 0 &&
                    x509_check_wildcard( cn, &cur->buf ) == 0 )
                {
                    break;
                }

                cur = cur->next;
            }

            if( cur == NULL )
                *flags |= MBEDTLS_X509_BADCERT_CN_MISMATCH;
        }
        else
        {
            while( name != NULL )
            {
                if( MBEDTLS_OID_CMP( MBEDTLS_OID_AT_CN, &name->oid ) == 0 )
                {
                    if( name->val.len == cn_len &&
                        x509_memcasecmp( name->val.p, cn, cn_len ) == 0 )
                        break;

                    if( name->val.len > 2 &&
                        memcmp( name->val.p, "*.", 2 ) == 0 &&
                        x509_check_wildcard( cn, &name->val ) == 0 )
                        break;
                }

                name = name->next;
            }

            if( name == NULL )
                *flags |= MBEDTLS_X509_BADCERT_CN_MISMATCH;
        }
    }

    /* Look for a parent in trusted CAs */
    for( parent = trust_ca; parent != NULL; parent = parent->next )
    {
        if( x509_crt_check_parent( crt, parent, 0, pathlen == 0 ) == 0 )
            break;
    }

    if( parent != NULL )
    {
        ret = x509_crt_verify_top( crt, parent, ca_crl, profile,
                                   pathlen, flags, f_vrfy, p_vrfy );
        if( ret != 0 )
            return( ret );
    }
    else
    {
        /* Look for a parent upwards the chain */
        for( parent = crt->next; parent != NULL; parent = parent->next )
        {
            if( x509_crt_check_parent( crt, parent, 0, pathlen == 0 ) == 0 )
                break;
        }

        /* Are we part of the chain or at the top? */
        if( parent != NULL )
        {
            ret = x509_crt_verify_child( crt, parent, trust_ca, ca_crl, profile,
                                         pathlen, flags, f_vrfy, p_vrfy );
            if( ret != 0 )
                return( ret );
        }
        else
        {
            ret = x509_crt_verify_top( crt, trust_ca, ca_crl, profile,
                                       pathlen, flags, f_vrfy, p_vrfy );
            if( ret != 0 )
                return( ret );
        }
    }

    if( *flags != 0 )
        return( MBEDTLS_ERR_X509_CERT_VERIFY_FAILED );

    return( 0 );
}